

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QWidget * __thiscall QAbstractItemView::indexWidget(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QWidget *pQVar2;
  bool bVar3;
  QEditorInfo *pQVar4;
  
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar3 = QAbstractItemViewPrivate::isIndexValid(this_00,index);
  if (bVar3) {
    pQVar4 = QAbstractItemViewPrivate::editorForIndex(this_00,index);
    pDVar1 = (pQVar4->widget).wp.d;
    if ((pDVar1 != (Data *)0x0) &&
       (pQVar2 = (QWidget *)(pQVar4->widget).wp.value,
       pQVar2 != (QWidget *)0x0 && *(int *)(pDVar1 + 4) != 0)) {
      return pQVar2;
    }
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget* QAbstractItemView::indexWidget(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    if (d->isIndexValid(index))
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            return editor;

    return nullptr;
}